

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

FileInfo * __thiscall llbuild::buildsystem::BuildValue::getNthOutputInfo(BuildValue *this,uint n)

{
  bool bVar1;
  uint uVar2;
  uint n_local;
  BuildValue *this_local;
  
  bVar1 = kindHasOutputInfo(this);
  if (!bVar1) {
    __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                  ,0x192,
                  "const FileInfo &llbuild::buildsystem::BuildValue::getNthOutputInfo(unsigned int) const"
                 );
  }
  uVar2 = getNumOutputs(this);
  if (n < uVar2) {
    bVar1 = hasMultipleOutputs(this);
    if (bVar1) {
      this_local = (BuildValue *)((this->valueData).asOutputInfos + n);
    }
    else {
      if (n != 0) {
        __assert_fail("n == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                      ,0x197,
                      "const FileInfo &llbuild::buildsystem::BuildValue::getNthOutputInfo(unsigned int) const"
                     );
      }
      this_local = (BuildValue *)&this->valueData;
    }
    return (FileInfo *)this_local;
  }
  __assert_fail("n < getNumOutputs()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0x193,
                "const FileInfo &llbuild::buildsystem::BuildValue::getNthOutputInfo(unsigned int) const"
               );
}

Assistant:

const FileInfo& getNthOutputInfo(unsigned n) const {
    assert(kindHasOutputInfo() && "invalid call for value kind");
    assert(n < getNumOutputs());
    if (hasMultipleOutputs()) {
      return valueData.asOutputInfos[n];
    } else {
      assert(n == 0);
      return valueData.asOutputInfo;
    }
  }